

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_slow.cc
# Opt level: O3

void * absl::lts_20240722::random_internal::RandenSlow::GetKeys(void)

{
  return &kRandenRoundKeys;
}

Assistant:

const void* RandenSlow::GetKeys() {
  // Round keys for one AES per Feistel round and branch.
  // The canonical implementation uses first digits of Pi.
#ifdef ABSL_IS_LITTLE_ENDIAN
  return kRandenRoundKeys;
#else
  return kRandenRoundKeysBE;
#endif
}